

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O1

string * pystring::upper(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  int __c;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  sVar2 = __return_storage_ptr__->_M_string_length;
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      __c = (int)pcVar1[sVar4];
      iVar3 = ::islower(__c);
      if (iVar3 != 0) {
        iVar3 = toupper(__c);
        pcVar1[sVar4] = (char)iVar3;
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string upper( const std::string & str )
    {
        std::string s( str ) ;
        std::string::size_type len = s.size(), i;

        for ( i = 0; i < len; ++i )
        {
            if ( ::islower( s[i] ) ) s[i] = (char) ::toupper( s[i] );
        }

        return s;
    }